

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::
AddNestedExtensions<google::protobuf::DescriptorProto>
          (DescriptorIndex *this,string_view filename,DescriptorProto *message_type)

{
  bool bVar1;
  Rep *pRVar2;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_01;
  void **ppvVar3;
  RepeatedPtrField<google::protobuf::DescriptorProto> *pRVar4;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *pRVar5;
  bool bVar6;
  
  this_00 = &(message_type->field_0)._impl_.nested_type_;
  pRVar4 = this_00;
  if ((*(byte *)((long)&message_type->field_0 + 0x20) & 1) != 0) {
    pRVar2 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    pRVar4 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)pRVar2->elements;
  }
  if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar2 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    this_00 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)pRVar2->elements;
  }
  ppvVar3 = &(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
            *(int *)((long)&message_type->field_0 + 0x28);
  bVar6 = pRVar4 == (RepeatedPtrField<google::protobuf::DescriptorProto> *)ppvVar3;
  if (!bVar6) {
    bVar1 = AddNestedExtensions<google::protobuf::DescriptorProto>
                      (this,filename,
                       (DescriptorProto *)(pRVar4->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    if (bVar1) {
      do {
        pRVar4 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)
                 &(pRVar4->super_RepeatedPtrFieldBase).current_size_;
        bVar6 = pRVar4 == (RepeatedPtrField<google::protobuf::DescriptorProto> *)ppvVar3;
        if (bVar6) goto LAB_001bffbf;
        bVar1 = AddNestedExtensions<google::protobuf::DescriptorProto>
                          (this,filename,*(DescriptorProto **)pRVar4);
      } while (bVar1);
    }
    if (!bVar6) {
      return false;
    }
  }
LAB_001bffbf:
  this_01 = &(message_type->field_0)._impl_.extension_;
  pRVar5 = this_01;
  if ((*(byte *)((long)&message_type->field_0 + 0x68) & 1) != 0) {
    pRVar2 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
    pRVar5 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)pRVar2->elements;
  }
  if (((ulong)(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar2 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
    this_01 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)pRVar2->elements;
  }
  ppvVar3 = &(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
            *(int *)((long)&message_type->field_0 + 0x70);
  bVar6 = pRVar5 == (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)ppvVar3;
  if ((!bVar6) &&
     (bVar1 = AddExtension<google::protobuf::FieldDescriptorProto>
                        (this,filename,
                         (FieldDescriptorProto *)
                         (pRVar5->super_RepeatedPtrFieldBase).tagged_rep_or_elem_), bVar1)) {
    do {
      pRVar5 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
               &(pRVar5->super_RepeatedPtrFieldBase).current_size_;
      bVar6 = pRVar5 == (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)ppvVar3;
      if (bVar6) {
        return bVar6;
      }
      bVar1 = AddExtension<google::protobuf::FieldDescriptorProto>
                        (this,filename,*(FieldDescriptorProto **)pRVar5);
    } while (bVar1);
  }
  return bVar6;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddNestedExtensions(
    absl::string_view filename, const DescProto& message_type) {
  for (const auto& nested_type : message_type.nested_type()) {
    if (!AddNestedExtensions(filename, nested_type)) return false;
  }
  for (const auto& extension : message_type.extension()) {
    if (!AddExtension(filename, extension)) return false;
  }
  return true;
}